

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa-verify.c
# Opt level: O0

int dsa_verify_hash_der(uint8_t *sha1,uchar *pubkey,size_t pubkey_len,uchar *sig,size_t sig_len)

{
  int iVar1;
  int ret;
  mp_int hash;
  mp_int s;
  mp_int r;
  mp_int keyY;
  mp_int keyG;
  mp_int keyQ;
  mp_int keyP;
  uchar *b;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar2;
  mp_int *in_stack_ffffffffffffff30;
  mp_int *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff48;
  mp_int *in_stack_ffffffffffffff60;
  mp_int *in_stack_ffffffffffffff68;
  mp_int *in_stack_ffffffffffffff70;
  mp_int *in_stack_ffffffffffffff78;
  mp_int *in_stack_ffffffffffffff80;
  mp_int *in_stack_ffffffffffffff88;
  mp_int *in_stack_ffffffffffffff90;
  mp_int *in_stack_ffffffffffffff98;
  mp_int *in_stack_ffffffffffffffa0;
  mp_int *in_stack_ffffffffffffffa8;
  mp_int *in_stack_ffffffffffffffc0;
  
  iVar2 = (int)((ulong)&stack0xffffffffffffff30 >> 0x20);
  b = (uchar *)0x0;
  mp_init_multi((mp_int *)&stack0xffffffffffffffc0,&stack0xffffffffffffffa8,&stack0xffffffffffffff90
                ,&stack0xffffffffffffff78,&stack0xffffffffffffff60,&stack0xffffffffffffff48);
  iVar1 = parse_der_pubkey((uchar *)in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (iVar1 == 0) {
    iVar2 = -3;
  }
  else {
    iVar1 = parse_der_signature(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (iVar1 == 0) {
      iVar2 = -5;
    }
    else {
      mp_read_unsigned_bin
                ((mp_int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),b,iVar2);
      iVar2 = _dsa_verify_hash(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffffc0);
    }
  }
  mp_clear_multi((mp_int *)&stack0xffffffffffffffc0,&stack0xffffffffffffffa8,
                 &stack0xffffffffffffff90,&stack0xffffffffffffff78,&stack0xffffffffffffff60,
                 &stack0xffffffffffffff48,&stack0xffffffffffffff30,0);
  return iVar2;
}

Assistant:

int dsa_verify_hash_der(const SHA1_t sha1, const unsigned char* pubkey, size_t pubkey_len, const unsigned char* sig, size_t sig_len)
{
	// Parse public key
	mp_int keyP, keyQ, keyG, keyY, r, s, hash;
	mp_init_multi(&keyP, &keyQ, &keyG, &keyY, &r, &s, &hash, NULL);

	int ret;

	if (parse_der_pubkey(pubkey, pubkey_len, &keyP, &keyQ, &keyG, &keyY) == 0)
	{
		ret = DSA_KEY_PARAM_ERROR;
		goto error;
	}

	// Parse signature
	if (parse_der_signature(sig, sig_len, &r, &s) == 0)
	{
		ret = DSA_SIGNATURE_PARAM_ERROR;
		goto error;
	}

	// Read hash, verify data
	mp_read_unsigned_bin(&hash, sha1, sizeof(SHA1_t));

	ret = _dsa_verify_hash(&hash, &keyP, &keyQ, &keyG, &keyY, &r, &s);

error:
	mp_clear_multi(&keyP, &keyQ, &keyG, &keyY, &r, &s, &hash, NULL);

	return ret;
}